

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall Catch::TestCase::TestCase(TestCase *this,ITestInvoker *testCase,TestCaseInfo *info)

{
  TestCaseInfo *in_RDI;
  TestCaseInfo *in_stack_ffffffffffffffc8;
  
  TestCaseInfo::TestCaseInfo(in_RDI,in_stack_ffffffffffffffc8);
  std::shared_ptr<Catch::ITestInvoker>::shared_ptr<Catch::ITestInvoker,void>
            ((shared_ptr<Catch::ITestInvoker> *)in_RDI,(ITestInvoker *)in_stack_ffffffffffffffc8);
  return;
}

Assistant:

TestCase::TestCase( ITestInvoker* testCase, TestCaseInfo&& info ) : TestCaseInfo( std::move(info) ), test( testCase ) {}